

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_clone(secp256k1_context *ctx)

{
  void *__dest;
  secp256k1_context *psVar1;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_context_clone_cold_2();
  }
  else if ((ctx->ecmult_gen_ctx).built != 0) {
    __dest = malloc(200);
    if (__dest == (void *)0x0) {
      (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
      (*(ctx->illegal_callback).fn)("prealloc != NULL",(ctx->illegal_callback).data);
      return (secp256k1_context *)0x0;
    }
    psVar1 = (secp256k1_context *)memcpy(__dest,ctx,200);
    return psVar1;
  }
  secp256k1_context_clone_cold_1();
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_clone(const secp256k1_context* ctx) {
    secp256k1_context* ret;
    size_t prealloc_size;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)checked_malloc(&ctx->error_callback, prealloc_size);
    ret = secp256k1_context_preallocated_clone(ctx, ret);
    return ret;
}